

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O3

void __thiscall tsip::tsip(tsip *this,string *_port,bool verbose)

{
  pointer pcVar1;
  int iVar2;
  string local_40;
  
  (this->gps_port)._M_dataplus._M_p = (pointer)&(this->gps_port).field_2;
  (this->gps_port)._M_string_length = 0;
  (this->gps_port).field_2._M_local_buf[0] = '\0';
  this->verbose = true;
  this->debug = false;
  this->_rad = 57.29577951308232;
  this->m_report_length = 0;
  this->m_state = START;
  (this->m_updated).value = 0;
  (this->m_ecef_position_s).valid = false;
  (this->m_ecef_position_d).valid = false;
  (this->m_ecef_velocity).valid = false;
  (this->m_sw_version).valid = false;
  (this->m_single_position).valid = false;
  (this->m_double_position).valid = false;
  (this->m_io_options).valid = false;
  (this->m_enu_velocity).valid = false;
  (this->m_utc_gps_time).valid = false;
  (this->m_primary_time).valid = false;
  (this->m_secondary_time).valid = false;
  (this->m_unknown).valid = false;
  memset(&this->m_report,0,0x400);
  iVar2 = std::__cxx11::string::compare((char *)_port);
  if (iVar2 != 0) {
    pcVar1 = (_port->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + _port->_M_string_length);
    open_gps_port(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

tsip::tsip(std::string _port, bool verbose) {
	// set verbose
	set_verbose(true);
	set_debug(false);

	//conversion factor to compute radians to degrees
	_rad = 180/M_PI;
	//init report fields
	init_rpt();

	if (_port != "") {
		open_gps_port(_port);
	}
	//// set the port
	//set_gps_port(port);

    //file = fopen(gps_port.c_str(), "r");
////        FILE *file = fopen(gps_port.c_str(), "r");

    //if(!file)
    //{
		////if open fails - terminate run
        //printf("Cannot open %s\n", gps_port.c_str());
        //exit;
    //}

    //setup_serial_port(file);
}